

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O3

RK_S32 mpp_hevc_decode_nal_pps(HEVCContext *s)

{
  long lVar1;
  BitReadCtx_t *bitctx;
  HEVCSPS *pHVar2;
  MppDecHwCap *pMVar3;
  void *pvVar4;
  RK_U32 *pRVar5;
  RK_U8 *pRVar6;
  RK_U8 RVar7;
  MPP_RET MVar8;
  int iVar9;
  RK_S32 RVar10;
  HEVCPPS *pps;
  RK_U32 *pRVar11;
  int iVar12;
  int iVar13;
  RK_U32 RVar14;
  char *pcVar15;
  HEVCPPS *pHVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  ulong uVar24;
  RK_U32 _out;
  HEVCPPS *local_48;
  HEVCSPS *local_40;
  ulong local_38;
  
  bitctx = &s->HEVClc->gb;
  pps = (HEVCPPS *)mpp_osal_calloc("mpp_hevc_decode_nal_pps",0x690);
  if (((byte)h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding PPS\n",(char *)0x0);
  }
  if (pps == (HEVCPPS *)0x0) {
    return -0x3ee;
  }
  MVar8 = mpp_read_ue(bitctx,&_out);
  bitctx->ret = MVar8;
  iVar9 = -0x3ec;
  if (MVar8 != MPP_OK) goto LAB_001a3912;
  uVar22 = (ulong)_out;
  if (0x3f < _out) {
    pcVar15 = "PPS id out of range: %d\n";
    uVar20 = uVar22;
    goto LAB_001a3906;
  }
  pHVar16 = (HEVCPPS *)s->pps_list[uVar22];
  if ((HEVCPPS *)s->pps_list[uVar22] == (HEVCPPS *)0x0) {
    pHVar16 = pps;
  }
  pps->pps_id = _out;
  pps->num_tile_columns = 1;
  pps->num_tile_rows = 1;
  pps->uniform_spacing_flag = '\x01';
  pps->loop_filter_across_tiles_enabled_flag = '\x01';
  pps->disable_dbf = '\0';
  pps->beta_offset = 0;
  pps->tc_offset = 0;
  MVar8 = mpp_read_ue(bitctx,&_out);
  bitctx->ret = MVar8;
  if (MVar8 != MPP_OK) goto LAB_001a390d;
  uVar20 = (ulong)_out;
  pps->sps_id = _out;
  if (uVar20 < 0x10) {
    pHVar2 = (HEVCSPS *)s->sps_list[uVar20];
    local_48 = pHVar16;
    if (pHVar2 == (HEVCSPS *)0x0) {
      pcVar15 = "SPS %u does not exist.\n";
      goto LAB_001a3906;
    }
    if (((byte)h265d_debug & 1) != 0) {
      _mpp_log_l(4,"H265PARSER_PS","Decoding PPS 1\n",(char *)0x0);
    }
    MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
    bitctx->ret = MVar8;
    if (MVar8 == MPP_OK) {
      pps->dependent_slice_segments_enabled_flag = (RK_U8)_out;
      MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      bitctx->ret = MVar8;
      if (MVar8 == MPP_OK) {
        pps->output_flag_present_flag = (RK_U8)_out;
        MVar8 = mpp_read_bits(bitctx,3,(RK_S32 *)&_out);
        bitctx->ret = MVar8;
        if (MVar8 == MPP_OK) {
          pps->num_extra_slice_header_bits = _out;
          MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
          bitctx->ret = MVar8;
          if (MVar8 == MPP_OK) {
            pps->sign_data_hiding_flag = (RK_U8)_out;
            MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
            bitctx->ret = MVar8;
            if (MVar8 == MPP_OK) {
              pps->cabac_init_present_flag = (RK_U8)_out;
              local_40 = pHVar2;
              MVar8 = mpp_read_ue(bitctx,&_out);
              bitctx->ret = MVar8;
              if (MVar8 == MPP_OK) {
                pps->num_ref_idx_l0_default_active = _out + 1;
                MVar8 = mpp_read_ue(bitctx,&_out);
                bitctx->ret = MVar8;
                if (MVar8 == MPP_OK) {
                  pps->num_ref_idx_l1_default_active = _out + 1;
                  MVar8 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                  bitctx->ret = MVar8;
                  if (MVar8 == MPP_OK) {
                    pps->pic_init_qp_minus26 = _out;
                    MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                    bitctx->ret = MVar8;
                    if (MVar8 == MPP_OK) {
                      pps->constrained_intra_pred_flag = (RK_U8)_out;
                      MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                      bitctx->ret = MVar8;
                      if (MVar8 == MPP_OK) {
                        pps->transform_skip_enabled_flag = (RK_U8)_out;
                        MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                        bitctx->ret = MVar8;
                        if (MVar8 == MPP_OK) {
                          pps->cu_qp_delta_enabled_flag = (RK_U8)_out;
                          pps->diff_cu_qp_delta_depth = 0;
                          if ((RK_U8)_out != '\0') {
                            MVar8 = mpp_read_ue(bitctx,&_out);
                            bitctx->ret = MVar8;
                            if (MVar8 != MPP_OK) goto LAB_001a390d;
                            pps->diff_cu_qp_delta_depth = _out;
                          }
                          MVar8 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                          bitctx->ret = MVar8;
                          if (MVar8 == MPP_OK) {
                            uVar20 = (ulong)_out;
                            pps->cb_qp_offset = _out;
                            if (_out - 0xd < 0xffffffe7) {
                              pcVar15 = "pps_cb_qp_offset out of range: %d\n";
                              goto LAB_001a3906;
                            }
                            MVar8 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                            bitctx->ret = MVar8;
                            if (MVar8 == MPP_OK) {
                              uVar20 = (ulong)_out;
                              pps->cr_qp_offset = _out;
                              if (_out - 0xd < 0xffffffe7) {
                                pcVar15 = "pps_cr_qp_offset out of range: %d\n";
                                goto LAB_001a3906;
                              }
                              MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                              bitctx->ret = MVar8;
                              if (MVar8 == MPP_OK) {
                                pps->pic_slice_level_chroma_qp_offsets_present_flag = (RK_U8)_out;
                                MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                bitctx->ret = MVar8;
                                if (MVar8 == MPP_OK) {
                                  pps->weighted_pred_flag = (RK_U8)_out;
                                  MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                  bitctx->ret = MVar8;
                                  if (MVar8 == MPP_OK) {
                                    pps->weighted_bipred_flag = (RK_U8)_out;
                                    MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                    bitctx->ret = MVar8;
                                    if (MVar8 == MPP_OK) {
                                      pps->transquant_bypass_enable_flag = (RK_U8)_out;
                                      MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                      bitctx->ret = MVar8;
                                      if (MVar8 == MPP_OK) {
                                        pps->tiles_enabled_flag = (RK_U8)_out;
                                        MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                        bitctx->ret = MVar8;
                                        if (MVar8 == MPP_OK) {
                                          pps->entropy_coding_sync_enabled_flag = (RK_U8)_out;
                                          pMVar3 = s->h265dctx->hw_info;
                                          if (pMVar3 != (MppDecHwCap *)0x0) {
                                            uVar19 = (uint)*(undefined8 *)&pMVar3->field_0x4;
                                            if ((uVar19 >> 0x14 & 1) == 0) {
                                              uVar18 = local_40->width;
                                              uVar21 = local_40->height;
                                              iVar9 = uVar21 * uVar18;
                                              iVar12 = (uVar19 & 0xe00000) * 0x20;
                                              if (iVar9 != iVar12 &&
                                                  SBORROW4(iVar9,iVar12) ==
                                                  (int)(iVar9 + (uVar19 & 0xe00000) * -0x20) < 0) {
                                                uVar20 = 0x2000;
                                                uVar24 = 0x2000;
LAB_001a3b39:
                                                iVar9 = 0;
                                                _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                      
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,(ulong)uVar18,(ulong)uVar21,uVar20,
                                                  uVar24);
                                                goto LAB_001a3912;
                                              }
                                            }
                                            else {
                                              RVar7 = pps->tiles_enabled_flag;
                                              if ((uVar19 >> 0xd & 1) == 0) {
                                                uVar18 = 0x440;
                                                if (RVar7 == '\0') {
                                                  uVar18 = 0x780;
                                                }
                                                uVar21 = 0x900;
                                                if (RVar7 == '\0') {
                                                  uVar21 = 0x1000;
                                                }
                                                bVar23 = (uVar19 >> 0xc & 1) == 0;
                                                uVar19 = 0x1000;
                                                if (bVar23) {
                                                  uVar19 = 0x780;
                                                }
                                                uVar20 = (ulong)uVar19;
                                                if (bVar23) {
                                                  uVar21 = uVar18;
                                                }
                                                uVar24 = (ulong)uVar21;
                                              }
                                              else {
                                                uVar20 = 0x2000;
                                                uVar24 = 0x10e0;
                                                if (RVar7 == '\0') {
                                                  uVar24 = 0x2000;
                                                }
                                              }
                                              uVar18 = local_40->width;
                                              uVar21 = local_40->height;
                                              iVar9 = (int)uVar20;
                                              if (((iVar9 < (int)uVar18) ||
                                                  ((int)uVar24 < (int)uVar21 && RVar7 != '\0')) ||
                                                 (iVar9 * iVar9 < (int)(uVar21 * uVar18)))
                                              goto LAB_001a3b39;
                                            }
                                          }
                                          if (pps->tiles_enabled_flag == '\0') {
LAB_001a3cb8:
                                            MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                            bitctx->ret = MVar8;
                                            if (MVar8 == MPP_OK) {
                                              pps->seq_loop_filter_across_slices_enabled_flag =
                                                   (RK_U8)_out;
                                              MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                              bitctx->ret = MVar8;
                                              if (MVar8 == MPP_OK) {
                                                pps->deblocking_filter_control_present_flag =
                                                     (RK_U8)_out;
                                                if ((RK_U8)_out == '\0') goto LAB_001a3d54;
                                                MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                bitctx->ret = MVar8;
                                                if (MVar8 == MPP_OK) {
                                                  pps->deblocking_filter_override_enabled_flag =
                                                       (RK_U8)_out;
                                                  MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar8;
                                                  if (MVar8 == MPP_OK) {
                                                    pps->disable_dbf = (RK_U8)_out;
                                                    if ((RK_U8)_out == '\0') {
                                                      MVar8 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                                      bitctx->ret = MVar8;
                                                      if (MVar8 == MPP_OK) {
                                                        pps->beta_offset = _out * 2;
                                                        MVar8 = mpp_read_se(bitctx,(RK_S32 *)&_out);
                                                        bitctx->ret = MVar8;
                                                        if (MVar8 == MPP_OK) {
                                                          uVar20 = (ulong)_out;
                                                          pps->tc_offset = _out * 2;
                                                          if (pps->beta_offset - 0xeU < 0xffffffe5)
                                                          {
                                                            uVar19 = pps->beta_offset / 2;
                                                            pcVar15 = 
                                                  "pps_beta_offset_div2 out of range: %d\n";
                                                  goto LAB_001a3eb6;
                                                  }
                                                  if (_out - 7 < 0xfffffff3) {
                                                    pcVar15 = 
                                                  "pps_tc_offset_div2 out of range: %d\n";
                                                  goto LAB_001a3906;
                                                  }
                                                  goto LAB_001a3d54;
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_001a3d54:
                                                    MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                    bitctx->ret = MVar8;
                                                    if (MVar8 == MPP_OK) {
                                                      pps->scaling_list_data_present_flag =
                                                           (RK_U8)_out;
                                                      if ((RK_U8)_out != '\0') {
                                                        set_default_scaling_list_data
                                                                  (&pps->scaling_list);
                                                        iVar9 = scaling_list_data((HEVCContext *)
                                                                                  s->HEVClc,
                                                                                  &pps->scaling_list
                                                                                  ,local_40);
                                                        if (iVar9 < 0) goto LAB_001a3912;
                                                        s->scaling_list_listen[uVar22 + 0x10] =
                                                             '\x01';
                                                      }
                                                      if (((byte)h265d_debug & 8) != 0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "num bit left %d",(char *)0x0,
                                                                   (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  }
                                                  MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar8;
                                                  if (MVar8 == MPP_OK) {
                                                    pps->lists_modification_present_flag =
                                                         (RK_U8)_out;
                                                    if (((byte)h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  }
                                                  MVar8 = mpp_read_ue(bitctx,&_out);
                                                  bitctx->ret = MVar8;
                                                  if (MVar8 == MPP_OK) {
                                                    pps->log2_parallel_merge_level = _out;
                                                    uVar19 = _out;
                                                    if (((byte)h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)bitctx->
                                                  num_remaining_bits_in_curr_byte_);
                                                  uVar19 = pps->log2_parallel_merge_level;
                                                  }
                                                  uVar20 = (ulong)uVar19;
                                                  pps->log2_parallel_merge_level = uVar19 + 2;
                                                  if (local_40->log2_ctb_size < (int)(uVar19 + 2)) {
                                                    pcVar15 = 
                                                  "log2_parallel_merge_level_minus2 out of range: %d\n"
                                                  ;
                                                  goto LAB_001a3906;
                                                  }
                                                  MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar8;
                                                  if (MVar8 == MPP_OK) {
                                                    pps->slice_header_extension_present_flag =
                                                         (RK_U8)_out;
                                                    MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                    bitctx->ret = MVar8;
                                                    if (MVar8 == MPP_OK) {
                                                      pps->pps_extension_flag = (RK_U8)_out;
                                                      RVar7 = (RK_U8)_out;
                                                      if (((byte)h265d_debug & 8) != 0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "pps_extension_flag %d",
                                                                   (char *)0x0,(ulong)(_out & 0xff))
                                                        ;
                                                        RVar7 = pps->pps_extension_flag;
                                                      }
                                                      if (RVar7 != '\0') {
                                                        MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)
                                                                                       &_out);
                                                        bitctx->ret = MVar8;
                                                        if (MVar8 != MPP_OK) goto LAB_001a390d;
                                                        pps->pps_range_extensions_flag = (RK_U8)_out
                                                        ;
                                                        MVar8 = mpp_skip_longbits(bitctx,7);
                                                        bitctx->ret = MVar8;
                                                        iVar9 = -0x3ec;
                                                        if (MVar8 != MPP_OK) goto LAB_001a3912;
                                                      }
                                                      pvVar4 = s->h265dctx->compare_info;
                                                      if (pvVar4 != (void *)0x0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "compare pps in",(char *)0x0);
                                                        RVar10 = compare_pps((HEVCPPS *)
                                                                             ((long)pvVar4 +
                                                                             uVar22 * 0x690 +
                                                                             0x39b80),pps);
                                                        if (RVar10 < 0) {
                                                          _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                          
                                                  "compare pps with openhevc error found",
                                                  (char *)0x0);
                                                  _mpp_log_l(2,"H265PARSER_PS",
                                                             "Assertion %s failed at %s:%d\n",
                                                             (char *)0x0,"0",
                                                             "mpp_hevc_decode_nal_pps",0x88b);
                                                  if ((mpp_debug._3_1_ & 0x10) != 0) {
                                                    abort();
                                                  }
                                                  return -1;
                                                  }
                                                  _mpp_log_l(4,"H265PARSER_PS","compare pps ok",
                                                             (char *)0x0);
                                                  }
                                                  if (pps->uniform_spacing_flag == '\0') {
LAB_001a4227:
                                                    if (s->pps_list[uVar22] == (RK_U8 *)0x0) {
                                                      s->pps_list[uVar22] = (RK_U8 *)pps;
                                                      s->ps_need_upate = '\x01';
                                                    }
                                                    else {
                                                      memcpy(s->pps_list[uVar22],pps,0x678);
                                                      mpp_hevc_pps_free((RK_U8 *)pps);
                                                      pRVar6 = s->pps_list[uVar22];
                                                      s->ps_need_upate = '\x01';
                                                      if (pRVar6 == (RK_U8 *)0x0) {
                                                        return 0;
                                                      }
                                                    }
                                                    s->pps_list_of_updated[uVar22] = '\x01';
                                                    return 0;
                                                  }
                                                  iVar9 = pps->num_tile_columns * 4;
                                                  if ((local_48->bufs).column_width_size < iVar9) {
                                                    pRVar11 = (RK_U32 *)
                                                              mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar9);
                                                  (local_48->bufs).column_width = pRVar11;
                                                  (local_48->bufs).column_width_size = iVar9;
                                                  }
                                                  iVar9 = pps->num_tile_rows * 4;
                                                  if ((local_48->bufs).row_height_size < iVar9) {
                                                    pRVar11 = (RK_U32 *)
                                                              mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar9);
                                                  (local_48->bufs).row_height = pRVar11;
                                                  (local_48->bufs).row_height_size = iVar9;
                                                  }
                                                  pRVar11 = (local_48->bufs).column_width;
                                                  iVar9 = -0x3ee;
                                                  if ((pRVar11 != (RK_U32 *)0x0) &&
                                                     (pRVar5 = (local_48->bufs).row_height,
                                                     pRVar5 != (RK_U32 *)0x0)) {
                                                    uVar20 = (ulong)(uint)pps->num_tile_columns;
                                                    if (0 < pps->num_tile_columns) {
                                                      lVar17 = 0;
                                                      do {
                                                        lVar1 = lVar17 + 1;
                                                        pRVar11[lVar17] =
                                                             ((int)lVar1 * local_40->ctb_width) /
                                                             (int)uVar20 -
                                                             ((int)lVar17 * local_40->ctb_width) /
                                                             (int)uVar20;
                                                        uVar20 = (ulong)pps->num_tile_columns;
                                                        lVar17 = lVar1;
                                                      } while (lVar1 < (long)uVar20);
                                                    }
                                                    uVar20 = (ulong)(uint)pps->num_tile_rows;
                                                    if (0 < pps->num_tile_rows) {
                                                      lVar17 = 0;
                                                      do {
                                                        lVar1 = lVar17 + 1;
                                                        pRVar5[lVar17] =
                                                             ((int)lVar1 * local_40->ctb_height) /
                                                             (int)uVar20 -
                                                             ((int)lVar17 * local_40->ctb_height) /
                                                             (int)uVar20;
                                                        uVar20 = (ulong)pps->num_tile_rows;
                                                        lVar17 = lVar1;
                                                      } while (lVar1 < (long)uVar20);
                                                    }
                                                    goto LAB_001a4227;
                                                  }
                                                  goto LAB_001a3912;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                          else {
                                            MVar8 = mpp_read_ue(bitctx,&_out);
                                            bitctx->ret = MVar8;
                                            if (MVar8 == MPP_OK) {
                                              pps->num_tile_columns = _out + 1;
                                              MVar8 = mpp_read_ue(bitctx,&_out);
                                              bitctx->ret = MVar8;
                                              if (MVar8 == MPP_OK) {
                                                iVar9 = _out + 1;
                                                pps->num_tile_rows = iVar9;
                                                iVar12 = pps->num_tile_columns;
                                                if ((iVar12 == 0) || (local_40->width <= iVar12)) {
                                                  uVar19 = iVar12 - 1;
                                                  pcVar15 = 
                                                  "num_tile_columns_minus1 out of range: %d\n";
LAB_001a3eb6:
                                                  uVar20 = (ulong)uVar19;
                                                  goto LAB_001a3906;
                                                }
                                                if ((iVar9 == 0) || (local_40->height <= iVar9)) {
                                                  pcVar15 = 
                                                  "num_tile_rows_minus1 out of range: %d\n";
                                                  uVar20 = (ulong)_out;
                                                  goto LAB_001a3906;
                                                }
                                                iVar12 = iVar12 * 4;
                                                if ((local_48->bufs).column_width_size < iVar12) {
                                                  pRVar11 = (RK_U32 *)
                                                            mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar12);
                                                  (local_48->bufs).column_width = pRVar11;
                                                  (local_48->bufs).column_width_size = iVar12;
                                                  iVar9 = pps->num_tile_rows;
                                                }
                                                iVar13 = iVar9 * 4;
                                                iVar12 = (local_48->bufs).row_height_size;
                                                if (SBORROW4(iVar12,iVar13) !=
                                                    iVar12 + iVar9 * -4 < 0) {
                                                  pRVar11 = (RK_U32 *)
                                                            mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)iVar13);
                                                  (local_48->bufs).row_height = pRVar11;
                                                  (local_48->bufs).row_height_size = iVar13;
                                                }
                                                iVar9 = -0x3ee;
                                                if (((local_48->bufs).column_width == (RK_U32 *)0x0)
                                                   || ((local_48->bufs).row_height == (RK_U32 *)0x0)
                                                   ) goto LAB_001a3912;
                                                MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                bitctx->ret = MVar8;
                                                if (MVar8 != MPP_OK) goto LAB_001a390d;
                                                pps->uniform_spacing_flag = (RK_U8)_out;
                                                if ((RK_U8)_out == '\0') {
                                                  if (pps->num_tile_columns < 2) {
                                                    uVar20 = (ulong)(pps->num_tile_columns - 1);
                                                    local_38 = 0;
                                                  }
                                                  else {
                                                    lVar17 = 0;
                                                    local_38 = 0;
                                                    do {
                                                      MVar8 = mpp_read_ue(bitctx,&_out);
                                                      bitctx->ret = MVar8;
                                                      if (MVar8 != MPP_OK) goto LAB_001a390d;
                                                      pRVar11 = (local_48->bufs).column_width;
                                                      pRVar11[lVar17] = _out;
                                                      RVar14 = pRVar11[lVar17];
                                                      pRVar11[lVar17] = RVar14 + 1;
                                                      local_38 = (ulong)((int)local_38 + RVar14 + 1)
                                                      ;
                                                      lVar17 = lVar17 + 1;
                                                      uVar20 = (long)pps->num_tile_columns - 1;
                                                    } while (lVar17 < (long)uVar20);
                                                  }
                                                  RVar14 = local_40->ctb_width - (int)local_38;
                                                  if (RVar14 == 0 ||
                                                      local_40->ctb_width < (int)local_38) {
                                                    pcVar15 = "Invalid tile widths.\n";
                                                  }
                                                  else {
                                                    (local_48->bufs).column_width[(int)uVar20] =
                                                         RVar14;
                                                    if (pps->num_tile_rows < 2) {
                                                      uVar20 = (ulong)(pps->num_tile_rows - 1);
                                                      local_38 = 0;
                                                    }
                                                    else {
                                                      lVar17 = 0;
                                                      local_38 = 0;
                                                      do {
                                                        MVar8 = mpp_read_ue(bitctx,&_out);
                                                        bitctx->ret = MVar8;
                                                        if (MVar8 != MPP_OK) goto LAB_001a390d;
                                                        pRVar11 = (local_48->bufs).row_height;
                                                        pRVar11[lVar17] = _out;
                                                        RVar14 = pRVar11[lVar17];
                                                        pRVar11[lVar17] = RVar14 + 1;
                                                        local_38 = (ulong)((int)local_38 + RVar14 +
                                                                          1);
                                                        lVar17 = lVar17 + 1;
                                                        uVar20 = (long)pps->num_tile_rows - 1;
                                                      } while (lVar17 < (long)uVar20);
                                                    }
                                                    RVar14 = local_40->ctb_height - (int)local_38;
                                                    if (RVar14 != 0 &&
                                                        (int)local_38 <= local_40->ctb_height) {
                                                      (local_48->bufs).row_height[(int)uVar20] =
                                                           RVar14;
                                                      goto LAB_001a3c93;
                                                    }
                                                    pcVar15 = "Invalid tile heights.\n";
                                                  }
                                                  _mpp_log_l(2,"H265PARSER_PS",pcVar15,(char *)0x0);
                                                }
                                                else {
LAB_001a3c93:
                                                  MVar8 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
                                                  bitctx->ret = MVar8;
                                                  if (MVar8 == MPP_OK) {
                                                    pps->loop_filter_across_tiles_enabled_flag =
                                                         (RK_U8)_out;
                                                    goto LAB_001a3cb8;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    pcVar15 = "SPS id out of range: %d\n";
LAB_001a3906:
    _mpp_log_l(2,"H265PARSER_PS",pcVar15,(char *)0x0,uVar20);
  }
LAB_001a390d:
  iVar9 = -0x3ec;
LAB_001a3912:
  mpp_hevc_pps_free((RK_U8 *)pps);
  return iVar9;
}

Assistant:

int mpp_hevc_decode_nal_pps(HEVCContext *s)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    HEVCSPS *sps = NULL;
    HEVCPPS *pps = mpp_calloc(HEVCPPS, 1);
    HevcPpsBufInfo *bufs = NULL;
    RK_S32 buf_size = 0;
    RK_U32 pps_id = 0;
    RK_S32 ret = 0;
    RK_S32 i;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS\n");

    if (!pps)
        return MPP_ERR_NOMEM;

    // Coded parameters
    READ_UE(gb, &pps_id);
    if (pps_id >= MAX_PPS_COUNT) {
        mpp_err( "PPS id out of range: %d\n", pps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }

    if (s->pps_list[pps_id]) {
        bufs = &(((HEVCPPS *)s->pps_list[pps_id])->bufs);
    } else {
        bufs = &pps->bufs;
    }

    pps->pps_id = pps_id;
    // Default values
    pps->loop_filter_across_tiles_enabled_flag = 1;
    pps->num_tile_columns                      = 1;
    pps->num_tile_rows                         = 1;
    pps->uniform_spacing_flag                  = 1;
    pps->disable_dbf                           = 0;
    pps->beta_offset                           = 0;
    pps->tc_offset                             = 0;

    READ_UE(gb, &pps->sps_id);
    if (pps->sps_id >= MAX_SPS_COUNT) {
        mpp_err( "SPS id out of range: %d\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    if (!s->sps_list[pps->sps_id]) {
        mpp_err( "SPS %u does not exist.\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    sps = (HEVCSPS *)s->sps_list[pps->sps_id];

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS 1\n");
    READ_ONEBIT(gb, &pps->dependent_slice_segments_enabled_flag);
    READ_ONEBIT(gb, &pps->output_flag_present_flag );
    READ_BITS(gb, 3, &pps->num_extra_slice_header_bits);

    READ_ONEBIT(gb, &pps->sign_data_hiding_flag);

    READ_ONEBIT(gb, &pps->cabac_init_present_flag);

    READ_UE(gb, &pps->num_ref_idx_l0_default_active);
    pps->num_ref_idx_l0_default_active +=  1;
    READ_UE(gb, &pps->num_ref_idx_l1_default_active);
    pps->num_ref_idx_l1_default_active += 1;

    READ_SE(gb, &pps->pic_init_qp_minus26);

    READ_ONEBIT(gb, & pps->constrained_intra_pred_flag);
    READ_ONEBIT(gb, &pps->transform_skip_enabled_flag);

    READ_ONEBIT(gb, &pps->cu_qp_delta_enabled_flag);
    pps->diff_cu_qp_delta_depth   = 0;
    if (pps->cu_qp_delta_enabled_flag)
        READ_UE(gb, &pps->diff_cu_qp_delta_depth);

    READ_SE(gb, &pps->cb_qp_offset);
    if (pps->cb_qp_offset < -12 || pps->cb_qp_offset > 12) {
        mpp_err( "pps_cb_qp_offset out of range: %d\n",
                 pps->cb_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_SE(gb, &pps->cr_qp_offset);
    if (pps->cr_qp_offset < -12 || pps->cr_qp_offset > 12) {
        mpp_err( "pps_cr_qp_offset out of range: %d\n",
                 pps->cr_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->pic_slice_level_chroma_qp_offsets_present_flag);

    READ_ONEBIT(gb, &pps->weighted_pred_flag);

    READ_ONEBIT(gb, &pps->weighted_bipred_flag);

    READ_ONEBIT(gb, &pps->transquant_bypass_enable_flag);
    READ_ONEBIT(gb, &pps->tiles_enabled_flag);
    READ_ONEBIT(gb, &pps->entropy_coding_sync_enabled_flag);

    // check support solution
    if (s->h265dctx->hw_info) {
        const MppDecHwCap *hw_info = s->h265dctx->hw_info;

        if (hw_info->cap_lmt_linebuf) {
            RK_S32 max_supt_width = PIXW_1080P;
            RK_S32 max_supt_height = pps->tiles_enabled_flag ? PIXH_1080P : PIXW_1080P;

            if (hw_info && hw_info->cap_8k) {
                max_supt_width = PIXW_8Kx4K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_8Kx4K : PIXW_8Kx4K;
            } else if (hw_info && hw_info->cap_4k) {
                max_supt_width = PIXW_4Kx2K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_4Kx2K : PIXW_4Kx2K;
            }

            if (sps->width > max_supt_width || (sps->height > max_supt_height && pps->tiles_enabled_flag)
                || sps->width * sps->height > max_supt_width * max_supt_width) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, max_supt_width, max_supt_height);
                goto err;
            }
        } else {
            if (sps->width * sps->height > PIXW_8Kx4K * PIXW_8Kx4K * hw_info->cap_core_num) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, PIXW_8Kx4K, PIXW_8Kx4K);
                goto err;
            }
        }
    }

    if (pps->tiles_enabled_flag) {
        READ_UE(gb, &pps->num_tile_columns);
        pps->num_tile_columns += 1;
        READ_UE(gb, &pps->num_tile_rows);
        pps->num_tile_rows += 1;
        if (pps->num_tile_columns == 0 ||
            pps->num_tile_columns >= sps->width) {
            mpp_err( "num_tile_columns_minus1 out of range: %d\n",
                     pps->num_tile_columns - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }
        if (pps->num_tile_rows == 0 ||
            pps->num_tile_rows >= sps->height) {
            mpp_err( "num_tile_rows_minus1 out of range: %d\n",
                     pps->num_tile_rows - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }

        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }

        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        READ_ONEBIT(gb, &pps->uniform_spacing_flag );
        if (!pps->uniform_spacing_flag) {
            RK_S32 sum = 0;
            for (i = 0; i < pps->num_tile_columns - 1; i++) {
                READ_UE(gb, &bufs->column_width[i]);
                bufs->column_width[i] += 1;
                sum                   += bufs->column_width[i];
            }
            if (sum >= sps->ctb_width) {
                mpp_err( "Invalid tile widths.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->column_width[pps->num_tile_columns - 1] = sps->ctb_width - sum;

            sum = 0;
            for (i = 0; i < pps->num_tile_rows - 1; i++) {
                READ_UE(gb, &bufs->row_height[i]);
                bufs->row_height[i] += 1;
                sum                 += bufs->row_height[i];
            }
            if (sum >= sps->ctb_height) {
                mpp_err( "Invalid tile heights.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->row_height[pps->num_tile_rows - 1] = sps->ctb_height - sum;
        }
        READ_ONEBIT(gb, &pps->loop_filter_across_tiles_enabled_flag);
    }

    READ_ONEBIT(gb, &pps->seq_loop_filter_across_slices_enabled_flag);
    READ_ONEBIT(gb, &pps->deblocking_filter_control_present_flag);
    if (pps->deblocking_filter_control_present_flag) {
        READ_ONEBIT(gb, &pps->deblocking_filter_override_enabled_flag);
        READ_ONEBIT(gb, & pps->disable_dbf);
        if (!pps->disable_dbf) {
            READ_SE(gb, &pps->beta_offset);
            pps->beta_offset = pps->beta_offset * 2;
            READ_SE(gb, &pps->tc_offset);
            pps->tc_offset = pps->tc_offset * 2;
            if (pps->beta_offset / 2 < -6 || pps->beta_offset / 2 > 6) {
                mpp_err( "pps_beta_offset_div2 out of range: %d\n",
                         pps->beta_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            if (pps->tc_offset / 2 < -6 || pps->tc_offset / 2 > 6) {
                mpp_err( "pps_tc_offset_div2 out of range: %d\n",
                         pps->tc_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
        }
    }

    READ_ONEBIT(gb, &pps->scaling_list_data_present_flag);
    if (pps->scaling_list_data_present_flag) {
        set_default_scaling_list_data(&pps->scaling_list);
        ret = scaling_list_data(s, &pps->scaling_list, sps);

        if (ret < 0)
            goto err;
        s->scaling_list_listen[pps_id + 16] = 1;
    }

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_ONEBIT(gb, & pps->lists_modification_present_flag);


    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_UE(gb, &pps->log2_parallel_merge_level);

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    pps->log2_parallel_merge_level += 2;
    if (pps->log2_parallel_merge_level > sps->log2_ctb_size) {
        mpp_err( "log2_parallel_merge_level_minus2 out of range: %d\n",
                 pps->log2_parallel_merge_level - 2);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->slice_header_extension_present_flag);
    READ_ONEBIT(gb, &pps->pps_extension_flag);
    h265d_dbg(H265D_DBG_PPS, "pps_extension_flag %d", pps->pps_extension_flag);
    if (pps->pps_extension_flag) {
        READ_ONEBIT(gb, &pps->pps_range_extensions_flag);
        SKIP_BITS(gb, 7); // pps_extension_7bits
    }

    if (s->h265dctx->compare_info != NULL) {
        CurrentFameInf_t *info = (CurrentFameInf_t *)s->h265dctx->compare_info;
        HEVCPPS *openhevc_pps = (HEVCPPS*)&info->pps[pps_id];
        mpp_log("compare pps in");
        if (compare_pps(openhevc_pps, (HEVCPPS*)pps) < 0) {
            mpp_err("compare pps with openhevc error found");
            mpp_assert(0);
            return -1;
        }
        mpp_log("compare pps ok");
    }

    // Inferred parameters
    if (pps->uniform_spacing_flag) {
        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }
        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        for (i = 0; i < pps->num_tile_columns; i++) {
            bufs->column_width[i] = ((i + 1) * sps->ctb_width) / pps->num_tile_columns -
                                    (i * sps->ctb_width) / pps->num_tile_columns;
        }

        for (i = 0; i < pps->num_tile_rows; i++) {
            bufs->row_height[i] = ((i + 1) * sps->ctb_height) / pps->num_tile_rows -
                                  (i * sps->ctb_height) / pps->num_tile_rows;
        }
    }

    if (s->pps_list[pps_id]) {
        memcpy(s->pps_list[pps_id], pps, sizeof(*pps) - sizeof(pps->bufs));
        mpp_hevc_pps_free((RK_U8 *)pps);
    } else {
        s->pps_list[pps_id] = (RK_U8 *)pps;
    }
    s->ps_need_upate = 1;

    if (s->pps_list[pps_id])
        s->pps_list_of_updated[pps_id] = 1;

    return 0;
__BITREAD_ERR:
    ret = MPP_ERR_STREAM;
err:
    if (pps)
        mpp_hevc_pps_free((RK_U8 *)pps);

    return ret;
}